

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctkern__pass_filter(fctkern_t *nk,char *test_name)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  size_t idx;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8b9
                  ,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  if (test_name == (char *)0x0) {
    __assert_fail("test_name != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8ba
                  ,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  if (*test_name == '\0') {
    __assert_fail("strlen(test_name) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8bb
                  ,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  sVar1 = (nk->prefix_list).used_itm_num;
  iVar6 = 1;
  if (sVar1 != 0) {
    for (idx = 0; idx != sVar1; idx = idx + 1) {
      pcVar3 = (char *)fct_nlist__at(&nk->prefix_list,idx);
      if (pcVar3 == (char *)0x0) {
        return 1;
      }
      cVar4 = *pcVar3;
      if (cVar4 == '\0') {
        return 1;
      }
      bVar7 = true;
      lVar5 = 0;
      while (cVar4 != '\0') {
        if (cVar4 != test_name[lVar5]) goto LAB_00106c23;
        lVar2 = lVar5 + 1;
        lVar5 = lVar5 + 1;
        bVar7 = false;
        cVar4 = pcVar3[lVar2];
      }
      if (!bVar7) {
        return 1;
      }
LAB_00106c23:
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static nbool_t
fctkern__pass_filter(fctkern_t *nk, char const *test_name)
{
    size_t prefix_i =0;
    size_t prefix_list_size =0;
    FCT_ASSERT( nk != NULL && "invalid arg");
    FCT_ASSERT( test_name != NULL );
    FCT_ASSERT( strlen(test_name) > 0 );
    prefix_list_size = fctkern__filter_cnt(nk);
    /* If there is no filter list, then we return FCT_TRUE always. */
    if ( prefix_list_size == 0 )
    {
        return FCT_TRUE;
    }
    /* Iterate through the prefix filter list, and see if we have
    anything that does not pass. All we require is ONE item that
    passes the test in order for us to succeed here. */
    for ( prefix_i = 0; prefix_i != prefix_list_size; ++prefix_i )
    {
        char const *prefix = (char const*)fct_nlist__at(
                                 &(nk->prefix_list), prefix_i
                             );
        nbool_t pass = fct_filter_pass(prefix, test_name);
        if ( pass )
        {
            return FCT_TRUE;
        }
    }
    /* Otherwise, we never managed to find a prefix that satisfied the
    supplied test name. Therefore we have failed to pass to the filter
    list test. */
    return FCT_FALSE;
}